

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

void Pdr_ManDumpClauses(Pdr_Man_t *p,char *pFileName,int fProved)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  Vec_Ptr_t *vCubes;
  void **__dest;
  Vec_Int_t *vFlopCounts;
  Abc_Frame_t *p_00;
  Abc_Ntk_t *pNtk;
  char **__ptr;
  Aig_Man_t *pAVar5;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  
  pcVar8 = pFileName;
  __stream = fopen(pFileName,"w");
  iVar3 = (int)pcVar8;
  if (__stream == (FILE *)0x0) {
    pcVar8 = "Cannot open file \"%s\" for writing invariant.\n";
  }
  else {
    iVar3 = Pdr_ManFindInvariantStart(p);
    if (fProved == 0) {
      pVVar2 = p->vInfCubes;
      vCubes = (Vec_Ptr_t *)malloc(0x10);
      uVar4 = pVVar2->nSize;
      vCubes->nSize = uVar4;
      iVar1 = pVVar2->nCap;
      vCubes->nCap = iVar1;
      if ((long)iVar1 == 0) {
        __dest = (void **)0x0;
      }
      else {
        __dest = (void **)malloc((long)iVar1 << 3);
      }
      vCubes->pArray = __dest;
      memcpy(__dest,pVVar2->pArray,(long)(int)uVar4 << 3);
    }
    else {
      vCubes = Pdr_ManCollectCubes(p,iVar3);
      uVar4 = vCubes->nSize;
    }
    if (1 < (int)uVar4) {
      qsort(vCubes->pArray,(ulong)uVar4,8,Pdr_SetCompare);
      uVar4 = vCubes->nSize;
    }
    if ((int)uVar4 < 1) {
      uVar7 = 0;
    }
    else {
      uVar6 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 + (*(int *)((long)vCubes->pArray[uVar6] + 8) != -1);
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    vFlopCounts = Pdr_ManCountFlops(p,vCubes);
    pcVar8 = "# Inductive invariant for \"%s\"\n";
    if (fProved == 0) {
      pcVar8 = "# Clauses of the last timeframe for \"%s\"\n";
    }
    fprintf(__stream,pcVar8,p->pAig->pName);
    pcVar8 = Aig_TimeStamp();
    fprintf(__stream,"# generated by PDR in ABC on %s\n",pcVar8);
    uVar4 = Pdr_ManCountVariables(p,iVar3);
    fprintf(__stream,".i %d\n",(ulong)uVar4);
    fwrite(".o 1\n",5,1,__stream);
    fprintf(__stream,".p %d\n",(ulong)uVar7);
    p_00 = Abc_FrameReadGlobalFrame();
    pNtk = Abc_FrameReadNtk(p_00);
    __ptr = Abc_NtkCollectCioNames(pNtk,0);
    if (__ptr != (char **)0x0) {
      fwrite(".ilb",4,1,__stream);
      pAVar5 = p->pAig;
      if (0 < pAVar5->nRegs) {
        iVar3 = vFlopCounts->nSize;
        lVar9 = 0;
        do {
          if (iVar3 <= lVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (vFlopCounts->pArray[lVar9] != 0) {
            fprintf(__stream," %s",__ptr[pAVar5->nTruePis + lVar9]);
            pAVar5 = p->pAig;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pAVar5->nRegs);
      }
      fputc(10,__stream);
      free(__ptr);
      fwrite(".ob inv\n",8,1,__stream);
    }
    iVar3 = vCubes->nSize;
    if (0 < iVar3) {
      lVar9 = 0;
      do {
        if (((Pdr_Set_t *)vCubes->pArray[lVar9])->nRefs != -1) {
          Pdr_SetPrint((FILE *)__stream,(Pdr_Set_t *)vCubes->pArray[lVar9],p->pAig->nRegs,
                       vFlopCounts);
          fwrite(" 1\n",3,1,__stream);
          iVar3 = vCubes->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar3);
    }
    fwrite(".e\n\n",4,1,__stream);
    fclose(__stream);
    if (vFlopCounts != (Vec_Int_t *)0x0) {
      if (vFlopCounts->pArray != (int *)0x0) {
        free(vFlopCounts->pArray);
      }
      free(vFlopCounts);
    }
    if (vCubes->pArray != (void **)0x0) {
      free(vCubes->pArray);
    }
    free(vCubes);
    iVar3 = (int)vCubes;
    pcVar8 = "Inductive invariant was written into file \"%s\".\n";
    if (fProved == 0) {
      pcVar8 = "Clauses of the last timeframe were written into file \"%s\".\n";
    }
  }
  Abc_Print(iVar3,pcVar8,pFileName);
  return;
}

Assistant:

void Pdr_ManDumpClauses( Pdr_Man_t * p, char * pFileName, int fProved )
{
    int fUseSupp = 1;
    FILE * pFile;
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    char ** pNamesCi;
    int i, kStart, Count = 0;
    // create file
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        Abc_Print( 1, "Cannot open file \"%s\" for writing invariant.\n", pFileName );
        return;
    } 
    // collect cubes
    kStart = Pdr_ManFindInvariantStart( p );
    if ( fProved )
        vCubes = Pdr_ManCollectCubes( p, kStart );
    else
        vCubes = Vec_PtrDup( p->vInfCubes );
    Vec_PtrSort( vCubes, (int (*)(void))Pdr_SetCompare );
//    Pdr_ManDumpAig( p->pAig, vCubes );
    // count cubes
    Count = 0;
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Count++;
    }
    // collect variable appearances
    vFlopCounts = fUseSupp ? Pdr_ManCountFlops( p, vCubes ) : NULL; 
    // output the header
    if ( fProved )
        fprintf( pFile, "# Inductive invariant for \"%s\"\n", p->pAig->pName );
    else
        fprintf( pFile, "# Clauses of the last timeframe for \"%s\"\n", p->pAig->pName );
    fprintf( pFile, "# generated by PDR in ABC on %s\n", Aig_TimeStamp() );
    fprintf( pFile, ".i %d\n", fUseSupp ? Pdr_ManCountVariables(p, kStart) : Aig_ManRegNum(p->pAig) );
    fprintf( pFile, ".o 1\n" );
    fprintf( pFile, ".p %d\n", Count );
    // output flop names
    pNamesCi = Abc_NtkCollectCioNames( Abc_FrameReadNtk( Abc_FrameReadGlobalFrame() ), 0 );
    if ( pNamesCi )
    {
        fprintf( pFile, ".ilb" );
        for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
            if ( !fUseSupp || Vec_IntEntry( vFlopCounts, i ) )
                fprintf( pFile, " %s", pNamesCi[Saig_ManPiNum(p->pAig) + i] );
        fprintf( pFile, "\n" );
        ABC_FREE( pNamesCi );
        fprintf( pFile, ".ob inv\n" );
    }
    // output cubes
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Pdr_SetPrint( pFile, pCube, Aig_ManRegNum(p->pAig), vFlopCounts );  
        fprintf( pFile, " 1\n" ); 
    }
    fprintf( pFile, ".e\n\n" );
    fclose( pFile );
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    if ( fProved )
        Abc_Print( 1, "Inductive invariant was written into file \"%s\".\n", pFileName );
    else
        Abc_Print( 1, "Clauses of the last timeframe were written into file \"%s\".\n", pFileName );
}